

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sha256.cpp
# Opt level: O1

void Sha256::Private::Transform(UInt32 *state,UInt32 *data)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  UInt32 *pUVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  UInt32 UVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  UInt32 aUStack_a0 [6];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  UInt32 T [8];
  UInt32 W [16];
  
  local_78 = *(undefined8 *)(state + 4);
  uStack_70 = *(undefined8 *)(state + 6);
  local_88 = *(undefined8 *)state;
  uStack_80 = *(undefined8 *)(state + 2);
  pUVar4 = K;
  uVar5 = 0;
  do {
    lVar7 = 0xe;
    lVar8 = 0;
    do {
      if (uVar5 == 0) {
        UVar9 = data[lVar7 + -0xe];
      }
      else {
        uVar6 = (uint)lVar7;
        uVar2 = T[uVar6 & 0xf];
        uVar3 = T[uVar6 - 0xd & 0xf];
        UVar9 = (uVar2 >> 10 ^ (uVar2 << 0xd | uVar2 >> 0x13) ^ (uVar2 << 0xf | uVar2 >> 0x11)) +
                T[uVar6 - 5 & 0xf] + aUStack_a0[lVar7] +
                (uVar3 >> 3 ^ (uVar3 << 0xe | uVar3 >> 0x12) ^ (uVar3 << 0x19 | uVar3 >> 7));
      }
      aUStack_a0[lVar7] = UVar9;
      uVar6 = (uint)lVar8;
      uVar2 = *(uint *)((long)&local_88 + (ulong)(uVar6 + 4 & 7) * 4);
      uVar3 = *(uint *)((long)&local_88 + (ulong)(uVar6 + 6 & 7) * 4);
      uVar10 = (ulong)(uVar6 - 1 & 7);
      iVar11 = ((uVar2 << 7 | uVar2 >> 0x19) ^
               (uVar2 << 0x15 | uVar2 >> 0xb) ^ (uVar2 << 0x1a | uVar2 >> 6)) + pUVar4[lVar7 + -0xe]
               + ((*(uint *)((long)&local_88 + (ulong)(uVar6 + 5 & 7) * 4) ^ uVar3) & uVar2 ^ uVar3)
               + UVar9 + *(int *)((long)&local_88 + uVar10 * 4);
      *(int *)((long)&local_88 + uVar10 * 4) = iVar11;
      piVar1 = (int *)((long)&local_88 + (ulong)(uVar6 + 3 & 7) * 4);
      *piVar1 = *piVar1 + iVar11;
      uVar2 = *(uint *)((long)&local_88 + (ulong)(uVar6 & 7) * 4);
      uVar3 = *(uint *)((long)&local_88 + (ulong)(uVar6 + 1 & 7) * 4);
      *(uint *)((long)&local_88 + uVar10 * 4) =
           ((uVar2 << 10 | uVar2 >> 0x16) ^
           (uVar2 << 0x13 | uVar2 >> 0xd) ^ (uVar2 << 0x1e | uVar2 >> 2)) +
           *(int *)((long)&local_88 + uVar10 * 4) +
           ((uVar3 | uVar2) & *(uint *)((long)&local_88 + (ulong)(uVar6 + 2 & 7) * 4) |
           uVar3 & uVar2);
      lVar8 = lVar8 + -1;
      lVar7 = lVar7 + 1;
    } while (lVar8 != -0x10);
    pUVar4 = pUVar4 + 0x10;
    bVar12 = uVar5 < 0x30;
    uVar5 = uVar5 + 0x10;
  } while (bVar12);
  lVar7 = 0;
  do {
    state[lVar7] = state[lVar7] + *(int *)((long)&local_88 + lVar7 * 4);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  return;
}

Assistant:

static void Transform(UInt32 *state, const UInt32 *data)
  {
    UInt32 W[16];
    unsigned j;
    #ifdef _SHA256_UNROLL2
    UInt32 a,b,c,d,e,f,g,h;
    a = state[0];
    b = state[1];
    c = state[2];
    d = state[3];
    e = state[4];
    f = state[5];
    g = state[6];
    h = state[7];
    #else
    UInt32 T[8];
    for (j = 0; j < 8; j++)
      T[j] = state[j];
    #endif

    for (j = 0; j < 64; j += 16)
    {
      #if defined(_SHA256_UNROLL) || defined(_SHA256_UNROLL2)
      RX_8(0); RX_8(8);
      #else
      unsigned i;
      for (i = 0; i < 16; i++) { R(i); }
      #endif
    }

    #ifdef _SHA256_UNROLL2
    state[0] += a;
    state[1] += b;
    state[2] += c;
    state[3] += d;
    state[4] += e;
    state[5] += f;
    state[6] += g;
    state[7] += h;
    #else
    for (j = 0; j < 8; j++)
      state[j] += T[j];
    #endif
  
    /* Wipe variables */
    /* memset(W, 0, sizeof(W)); */
    /* memset(T, 0, sizeof(T)); */
  }